

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  Types TVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  pointer ppcVar3;
  bool bVar4;
  __type _Var5;
  string *psVar6;
  cmSourceGroup *this_02;
  mapped_type *pmVar7;
  iterator iVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  char *pcVar11;
  ostream *poVar12;
  cmCustomCommand *pcVar13;
  cmGeneratedFileStream *this_03;
  cmSourceFileLocation *pcVar14;
  pointer ppcVar15;
  long lVar16;
  pointer __k;
  pointer pbVar17;
  pointer ppcVar18;
  pointer ppcVar19;
  cmGhsMultiTargetGenerator *pcVar20;
  int iVar21;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  pointer ppcVar22;
  string *gn_1;
  pointer ppcVar23;
  pointer ppcVar24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_4d1;
  cmGhsMultiTargetGenerator *local_4d0;
  cmGeneratedFileStream *local_4c8;
  cmGeneratedFileStream *local_4c0;
  pointer local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string fpath;
  cmGeneratedFileStream *f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  string local_3a8;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  string lpath;
  string local_298;
  string gn;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [424];
  
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c0 = (cmGeneratedFileStream *)fout_proj;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&sources,&this->ConfigName);
  local_4d0 = this;
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&sourceGroups,&this->Makefile->SourceGroups);
  ppcVar19 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groupFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groupNames._M_t._M_impl.super__Rb_tree_header._M_header;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppcVar15 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar15 != ppcVar19;
      ppcVar15 = ppcVar15 + 1) {
    pcVar2 = local_4d0->Makefile;
    psVar6 = cmSourceFile::GetFullPath(*ppcVar15,(string *)0x0);
    this_02 = cmMakefile::FindSourceGroup(pcVar2,psVar6,&sourceGroups);
    psVar6 = cmSourceGroup::GetFullName_abi_cxx11_(this_02);
    std::__cxx11::string::string((string *)&gn,(string *)psVar6);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,&gn);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(pmVar7,ppcVar15);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&groupNames,&gn);
    std::__cxx11::string::~string((string *)&gn);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gn,"CMake Rules",(allocator<char> *)&lpath);
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"Header Files",(allocator<char> *)&fpath);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"Source Files",(allocator<char> *)&local_3a8);
  std::__cxx11::string::string<std::allocator<char>>(local_218,"Object Files",(allocator<char> *)&f)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"Object Libraries",(allocator<char> *)&groupFilesList);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"Resources",(allocator<char> *)&gfiles);
  __l._M_len = 6;
  __l._M_array = &gn;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&standardGroups,__l,(allocator_type *)&customCommands);
  lVar16 = 0xa0;
  do {
    std::__cxx11::string::~string(local_258 + lVar16 + -0x20);
    lVar16 = lVar16 + -0x20;
  } while (lVar16 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&groupFilesList,groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)&gn);
  iVar21 = 0;
  for (pbVar17 = standardGroups.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; lVar16 = (long)iVar21,
      pbVar17 !=
      standardGroups.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar17 = pbVar17 + 1) {
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&groupNames._M_t,pbVar17);
    if ((_Rb_tree_header *)iVar8._M_node == &groupNames._M_t._M_impl.super__Rb_tree_header) {
      if ((local_4d0->TagType == CUSTOM_TARGET) &&
         (bVar4 = std::operator==(pbVar17,"CMake Rules"), bVar4)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&groupFilesList,
                 ((long)groupFilesList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)groupFilesList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
        std::__cxx11::string::_M_assign
                  ((string *)
                   (groupFilesList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16));
        goto LAB_001caa16;
      }
    }
    else {
      std::__cxx11::string::_M_assign
                ((string *)
                 (groupFilesList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar16));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&groupNames._M_t,pbVar17);
LAB_001caa16:
      iVar21 = iVar21 + 1;
    }
  }
  gn._M_dataplus._M_p = (pointer)&gn.field_2;
  gn._M_string_length = 0;
  gn.field_2._M_local_buf[0] = '\0';
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&groupNames._M_t,&gn);
  if ((_Rb_tree_header *)iVar8._M_node != &groupNames._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (groupFilesList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&groupNames._M_t,&gn);
  }
  std::__cxx11::string::~string((string *)&gn);
  lVar16 = lVar16 << 5;
  p_Var9 = groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pbVar17 = groupFilesList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        (_Rb_tree_header *)p_Var9 != &groupNames._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((groupFilesList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16));
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    lVar16 = lVar16 + 0x20;
  }
  for (__k = groupFilesList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar17; __k = __k + 1) {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,__k);
    ppcVar19 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
               .super__Vector_impl_data._M_start;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,__k);
    ppcVar15 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    if (ppcVar19 != ppcVar15) {
      uVar10 = (long)ppcVar15 - (long)ppcVar19 >> 3;
      lVar16 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                (ppcVar19,ppcVar15,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppcVar15 - (long)ppcVar19 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar19,ppcVar15);
      }
      else {
        ppcVar22 = ppcVar19 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar19,ppcVar22);
        for (; ppcVar22 != ppcVar15; ppcVar22 = ppcVar22 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar22);
        }
      }
    }
  }
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_440 = &local_4d0->Name;
  pbVar17 = groupFilesList.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppcVar3 = gfiles.
              super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppcVar18 = gfiles.
               super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar17 ==
        groupFilesList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (; ppcVar18 != ppcVar3; ppcVar18 = ppcVar18 + 1) {
        cmGeneratedFileStream::Close(*ppcVar18);
      }
      std::_Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::
      ~_Vector_base(&gfiles.
                     super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>
                   );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&groupFilesList);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&standardGroups);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&groupNames._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
      ::~_Rb_tree(&groupFiles._M_t);
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&sourceGroups);
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
      return;
    }
    this_00 = local_4d0->GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gn,"GHS_NO_SOURCE_GROUP_FILE",(allocator<char> *)&fpath);
    pcVar11 = cmGeneratorTarget::GetProperty(this_00,&gn);
    bVar4 = cmSystemTools::IsOn(pcVar11);
    if (bVar4) {
      std::__cxx11::string::~string((string *)&gn);
LAB_001cacbe:
      if (pbVar17->_M_string_length == 0) {
        poVar12 = std::operator<<((ostream *)local_4c0,"{comment} Others");
      }
      else {
        poVar12 = std::operator<<((ostream *)local_4c0,"{comment} ");
        poVar12 = std::operator<<(poVar12,(string *)pbVar17);
      }
      std::endl<char,std::char_traits<char>>(poVar12);
      local_4c8 = local_4c0;
    }
    else {
      pcVar2 = local_4d0->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lpath,"CMAKE_GHS_NO_SOURCE_GROUP_FILE",(allocator<char> *)&f);
      pcVar11 = cmMakefile::GetDefinition(pcVar2,&lpath);
      bVar4 = cmSystemTools::IsOn(pcVar11);
      std::__cxx11::string::~string((string *)&lpath);
      std::__cxx11::string::~string((string *)&gn);
      if (bVar4) goto LAB_001cacbe;
      local_4c8 = local_4c0;
      if (pbVar17->_M_string_length == 0) {
LAB_001cb210:
        poVar12 = std::operator<<((ostream *)local_4c8,"{comment} Others");
        std::endl<char,std::char_traits<char>>(poVar12);
      }
      else {
        std::__cxx11::string::string((string *)&gn,(string *)pbVar17);
        cmsys::SystemTools::ReplaceString(&gn,"\\","_");
        (*(local_4d0->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                  (&lpath,local_4d0->LocalGenerator,local_4d0->GeneratorTarget);
        std::__cxx11::string::append((char *)&lpath);
        std::__cxx11::string::append((string *)&lpath);
        std::__cxx11::string::append((char *)&lpath);
        psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           (&local_4d0->LocalGenerator->super_cmLocalGenerator);
        std::__cxx11::string::string((string *)&fpath,(string *)psVar6);
        std::__cxx11::string::append((char *)&fpath);
        std::__cxx11::string::append((string *)&fpath);
        this_03 = (cmGeneratedFileStream *)operator_new(0x248);
        cmGeneratedFileStream::cmGeneratedFileStream(this_03,&fpath,false,None);
        f = this_03;
        cmGeneratedFileStream::SetCopyIfDifferent(this_03,true);
        std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::push_back
                  (&gfiles,&f);
        local_4c8 = f;
        cmGlobalGhsMultiGenerator::WriteFileHeader
                  ((cmGlobalGhsMultiGenerator *)
                   (local_4d0->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,(ostream *)f)
        ;
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)f);
        poVar12 = std::operator<<((ostream *)local_4c0,(string *)&lpath);
        std::operator<<(poVar12," ");
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_4c0);
        std::__cxx11::string::~string((string *)&fpath);
        std::__cxx11::string::~string((string *)&lpath);
        std::__cxx11::string::~string((string *)&gn);
        if (pbVar17->_M_string_length == 0) goto LAB_001cb210;
      }
    }
    bVar4 = std::operator!=(pbVar17,"CMake Rules");
    if (bVar4) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
               ::operator[](&groupFiles,pbVar17);
      local_4b8 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar19 = (pmVar7->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                      _M_impl.super__Vector_impl_data._M_start; ppcVar19 != local_4b8;
          ppcVar19 = ppcVar19 + 1) {
        this_01 = *ppcVar19;
        psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(this_01);
        std::__cxx11::string::string((string *)&gn,(string *)psVar6);
        cmSystemTools::ConvertToOutputSlashes(&gn);
        lpath._M_string_length = 0;
        lpath.field_2._M_local_buf[0] = '\0';
        TVar1 = local_4d0->TagType;
        lpath._M_dataplus._M_p = (pointer)&lpath.field_2;
        if ((TVar1 == CUSTOM_TARGET) &&
           (cmSourceFile::GetLanguage_abi_cxx11_(&local_3a8,this_01),
           local_3a8._M_string_length != 0)) {
          std::__cxx11::string::~string((string *)&local_3a8);
LAB_001cade3:
          bVar4 = true;
          std::__cxx11::string::assign((char *)&lpath);
        }
        else {
          pcVar13 = cmSourceFile::GetCustomCommand(this_01);
          if (TVar1 == CUSTOM_TARGET) {
            std::__cxx11::string::~string((string *)&local_3a8);
          }
          if (pcVar13 != (cmCustomCommand *)0x0) goto LAB_001cade3;
          bVar4 = false;
        }
        poVar12 = std::operator<<((ostream *)local_4c8,(string *)&lpath);
        poVar12 = std::operator<<(poVar12,(string *)&gn);
        std::endl<char,std::char_traits<char>>(poVar12);
        if (!bVar4) {
          psVar6 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
          bVar4 = std::operator!=("ld",psVar6);
          if (bVar4) {
            psVar6 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
            bVar4 = std::operator!=("int",psVar6);
            if (bVar4) {
              psVar6 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
              bVar4 = std::operator!=("bsp",psVar6);
              if (bVar4) {
                WriteObjectLangOverride((ostream *)local_4c8,this_01);
              }
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fpath,"INCLUDE_DIRECTORIES",(allocator<char> *)&customCommands);
          pcVar20 = (cmGhsMultiTargetGenerator *)&f;
          std::__cxx11::string::string<std::allocator<char>>((string *)&f,"-I",&local_4d1);
          WriteSourceProperty(pcVar20,(ostream *)local_4c8,this_01,&fpath,(string *)&f);
          std::__cxx11::string::~string((string *)&f);
          std::__cxx11::string::~string((string *)&fpath);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fpath,"COMPILE_DEFINITIONS",(allocator<char> *)&customCommands);
          pcVar20 = (cmGhsMultiTargetGenerator *)&f;
          std::__cxx11::string::string<std::allocator<char>>((string *)&f,"-D",&local_4d1);
          WriteSourceProperty(pcVar20,(ostream *)local_4c8,this_01,&fpath,(string *)&f);
          std::__cxx11::string::~string((string *)&f);
          std::__cxx11::string::~string((string *)&fpath);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fpath,"COMPILE_OPTIONS",(allocator<char> *)&customCommands);
          pcVar20 = (cmGhsMultiTargetGenerator *)&f;
          std::__cxx11::string::string<std::allocator<char>>((string *)&f,"",&local_4d1);
          WriteSourceProperty(pcVar20,(ostream *)local_4c8,this_01,&fpath,(string *)&f);
          std::__cxx11::string::~string((string *)&f);
          std::__cxx11::string::~string((string *)&fpath);
          psVar6 = cmGeneratorTarget::GetObjectName_abi_cxx11_(local_4d0->GeneratorTarget,this_01);
          std::__cxx11::string::string((string *)&fpath,(string *)psVar6);
          if ((fpath._M_string_length != 0) &&
             (bVar4 = cmGeneratorTarget::HasExplicitObjectName(local_4d0->GeneratorTarget,this_01),
             bVar4)) {
            poVar12 = std::operator<<((ostream *)local_4c8,"    -o ");
            poVar12 = std::operator<<(poVar12,(string *)&fpath);
            std::endl<char,std::char_traits<char>>(poVar12);
          }
          std::__cxx11::string::~string((string *)&fpath);
        }
        std::__cxx11::string::~string((string *)&lpath);
        std::__cxx11::string::~string((string *)&gn);
      }
    }
    else {
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ComputeCustomCommandOrder(local_4d0,&customCommands);
      ppcVar24 = customCommands.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (bVar4) {
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_4d0->GeneratorTarget);
        std::operator+(&lpath,"The custom commands for target [",psVar6);
        std::operator+(&gn,&lpath,"] had a cycle.\n");
        std::__cxx11::string::~string((string *)&lpath);
        cmSystemTools::Error(&gn);
        std::__cxx11::string::~string((string *)&gn);
      }
      else {
        do {
          ppcVar23 = ppcVar24;
          if (ppcVar23 ==
              customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_001cb2a3;
          pcVar14 = cmSourceFile::GetLocation(*ppcVar23);
          std::operator+(&gn,local_440,".rule");
          _Var5 = std::operator==(&pcVar14->Name,&gn);
          std::__cxx11::string::~string((string *)&gn);
          ppcVar24 = ppcVar23 + 1;
        } while (!_Var5);
        std::_V2::
        __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                  (ppcVar23,ppcVar23 + 1,
                   customCommands.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        ppcVar23 = customCommands.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
LAB_001cb2a3:
        local_4b8 = (pointer)((ulong)local_4b8 & 0xffffffff00000000);
        for (ppcVar24 = customCommands.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar24 != ppcVar23;
            ppcVar24 = ppcVar24 + 1) {
          pcVar13 = cmSourceFile::GetCustomCommand(*ppcVar24);
          std::__cxx11::string::string((string *)&local_298,(string *)&this->ConfigName);
          pcVar20 = local_4d0;
          cmCustomCommandGenerator::cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)&lpath,pcVar13,&local_298,
                     &local_4d0->LocalGenerator->super_cmLocalGenerator);
          std::__cxx11::string::~string((string *)&local_298);
          psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                             (&pcVar20->LocalGenerator->super_cmLocalGenerator);
          std::__cxx11::string::string((string *)&fpath,(string *)psVar6);
          (*(local_4d0->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                     local_4d0->LocalGenerator,local_4d0->GeneratorTarget);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gn,
                         "/",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f
                        );
          std::__cxx11::string::append((string *)&fpath);
          std::__cxx11::string::~string((string *)&gn);
          std::__cxx11::string::~string((string *)&f);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,"/"
                         ,local_440);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gn,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                         "_cc");
          std::__cxx11::string::append((string *)&fpath);
          std::__cxx11::string::~string((string *)&gn);
          std::__cxx11::string::~string((string *)&f);
          std::__cxx11::to_string((string *)&f,(int)local_4b8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gn,
                         (string *)&f,"_");
          std::__cxx11::string::append((string *)&fpath);
          std::__cxx11::string::~string((string *)&gn);
          std::__cxx11::string::~string((string *)&f);
          cmSourceFile::GetLocation(*ppcVar24);
          std::__cxx11::string::append((string *)&fpath);
          std::__cxx11::string::append((char *)&fpath);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&gn,&fpath,false,None);
          cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&gn,true);
          WriteCustomCommandsHelper(local_4d0,(ostream *)&gn,(cmCustomCommandGenerator *)&lpath);
          pcVar20 = (cmGhsMultiTargetGenerator *)&gn;
          cmGeneratedFileStream::Close((cmGeneratedFileStream *)&gn);
          WriteCustomCommandLine
                    (pcVar20,(ostream *)local_4c8,&fpath,(cmCustomCommandGenerator *)&lpath);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gn);
          std::__cxx11::string::~string((string *)&fpath);
          cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&lpath);
          local_4b8 = (pointer)CONCAT44(local_4b8._4_4_,(int)local_4b8 + 1);
        }
      }
      if (local_4d0->TagType == CUSTOM_TARGET) {
        WriteBuildEvents(local_4d0,(ostream *)local_4c8);
      }
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
    }
    pbVar17 = pbVar17 + 1;
  } while( true );
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (auto& sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->GetFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->GetFullPath() < r->GetFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmSystemTools::IsOn(
        this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      cmSystemTools::IsOn(
        this->Makefile->GetDefinition("CMAKE_GHS_NO_SOURCE_GROUP_FILE"));
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
      lpath += "/";
      lpath += gname;
      lpath += cmGlobalGhsMultiGenerator::FILE_EXTENSION;
      std::string fpath = this->LocalGenerator->GetCurrentBinaryDirectory();
      fpath += "/";
      fpath += lpath;
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << std::endl;
      } else {
        *fout << "{comment} " << sg << std::endl;
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others" << std::endl;
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << std::endl;
        if (compile) {
          if ("ld" != si->GetExtension() && "int" != si->GetExtension() &&
              "bsp" != si->GetExtension()) {
            WriteObjectLangOverride(*fout, si);
          }

          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << std::endl;
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname =
            this->LocalGenerator->GetCurrentBinaryDirectory();
          fname += "/" +
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
          fname += "/" + this->Name + "_cc";
          fname += std::to_string(cmdcount++) + "_";
          fname += (sf->GetLocation()).GetName();
          fname += this->CmdWindowsShell ? ".bat" : ".sh";
          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}